

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall MixSegmentTest_Test1_Test::TestBody(MixSegmentTest_Test1_Test *this)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_01;
  bool bVar1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  string expected;
  string actual;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string sentence;
  MixSegment segment;
  string *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  int iVar3;
  char *expected_expression;
  string *in_stack_fffffffffffffb70;
  allocator<char> *file;
  string *in_stack_fffffffffffffb78;
  Type type;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  undefined1 uVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  MixSegment *in_stack_fffffffffffffb90;
  Message *in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  undefined1 uVar6;
  AssertionResult local_3c8;
  allocator<char> local_3b1;
  string local_3b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  AssertionResult local_350;
  allocator<char> local_339;
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  AssertionResult local_2d8;
  allocator<char> local_2c1;
  string local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  string local_290 [36];
  uint local_26c;
  AssertionResult local_258;
  allocator<char> local_241;
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  string local_210 [32];
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  char local_1b0 [24];
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [55];
  allocator<char> local_111;
  string local_110 [272];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  cppjieba::MixSegment::MixSegment
            ((MixSegment *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::string(local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c56ef);
  std::__cxx11::string::string((string *)&local_1d0);
  std::__cxx11::string::string(local_1f0);
  std::__cxx11::string::operator=(local_198,anon_var_dwarf_75420);
  std::__cxx11::string::operator=(local_1f0,anon_var_dwarf_75439);
  cppjieba::MixSegment::Cut
            ((MixSegment *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1c5752);
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb48);
  local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88._M_current,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  _Var5._M_current._7_1_ = in_stack_fffffffffffffb87;
  _Var5._M_current._0_7_ = in_stack_fffffffffffffb80;
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffffb88,_Var5,in_stack_fffffffffffffb78);
  std::__cxx11::string::operator=((string *)&local_1d0,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    testing::AssertionResult::failure_message((AssertionResult *)0x1c59c7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               (Type)((ulong)in_stack_fffffffffffffb78 >> 0x20),(char *)in_stack_fffffffffffffb70,
               (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
               in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    testing::Message::~Message((Message *)0x1c5a2a);
  }
  local_26c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c5a98);
  if (local_26c == 0) {
    std::__cxx11::string::operator=(local_198,anon_var_dwarf_754b6);
    std::__cxx11::string::operator=(local_1f0,anon_var_dwarf_754cf);
    cppjieba::MixSegment::Cut
              ((MixSegment *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
               in_stack_fffffffffffffb48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1c5af2);
    local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb48);
    local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88._M_current,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    end._M_current._7_1_ = in_stack_fffffffffffffb87;
    end._M_current._0_7_ = in_stack_fffffffffffffb80;
    limonp::
    Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (in_stack_fffffffffffffb88,end,in_stack_fffffffffffffb78);
    std::__cxx11::string::operator=((string *)&local_1d0,local_290);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
               in_stack_fffffffffffffb58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
    uVar6 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
      in_stack_fffffffffffffba8 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x1c5c9f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 (Type)((ulong)in_stack_fffffffffffffb78 >> 0x20),(char *)in_stack_fffffffffffffb70,
                 (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(char *)in_stack_fffffffffffffb60);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
      testing::Message::~Message((Message *)0x1c5cfc);
    }
    local_26c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c5d6a);
    if (local_26c == 0) {
      std::__cxx11::string::operator=(local_198,anon_var_dwarf_754e8);
      std::__cxx11::string::operator=(local_1f0,anon_var_dwarf_75501);
      cppjieba::MixSegment::Cut
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88._M_current,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 SUB81((ulong)in_stack_fffffffffffffb78 >> 0x38,0));
      local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffb48);
      local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88._M_current,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
      end_00._M_current._7_1_ = in_stack_fffffffffffffb87;
      end_00._M_current._0_7_ = in_stack_fffffffffffffb80;
      limonp::
      Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (in_stack_fffffffffffffb88,end_00,in_stack_fffffffffffffb78);
      pbVar2 = &local_1d0;
      _Var5._M_current = &local_308;
      std::__cxx11::string::operator=((string *)pbVar2,(string *)_Var5._M_current);
      std::__cxx11::string::~string((string *)_Var5._M_current);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator(&local_339);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
      iVar3 = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
      uVar4 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffb80));
        in_stack_fffffffffffffb78 =
             (string *)testing::AssertionResult::failure_message((AssertionResult *)0x1c5f67);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffb80),
                   (Type)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                   (char *)in_stack_fffffffffffffb70,iVar3,(char *)in_stack_fffffffffffffb60);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffbb0),
                   in_stack_fffffffffffffba8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
        testing::Message::~Message((Message *)0x1c5fc4);
      }
      local_26c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c6032);
      if (local_26c == 0) {
        std::__cxx11::string::operator=(local_198,anon_var_dwarf_754e8);
        std::__cxx11::string::operator=(local_1f0,anon_var_dwarf_7551a);
        cppjieba::MixSegment::Cut
                  ((MixSegment *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1c608c);
        expected_expression = local_1b0;
        local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffb48);
        local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffb48);
        file = &local_3b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (pbVar2,(char *)_Var5._M_current,
                   (allocator<char> *)CONCAT17(uVar4,in_stack_fffffffffffffb80));
        end_01._M_current._7_1_ = uVar4;
        end_01._M_current._0_7_ = in_stack_fffffffffffffb80;
        limonp::
        Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (_Var5,end_01,in_stack_fffffffffffffb78);
        type = (Type)((ulong)in_stack_fffffffffffffb78 >> 0x20);
        in_stack_fffffffffffffb60 = &local_1d0;
        pbVar2 = &local_380;
        std::__cxx11::string::operator=((string *)in_stack_fffffffffffffb60,(string *)pbVar2);
        std::__cxx11::string::~string((string *)pbVar2);
        std::__cxx11::string::~string(local_3b0);
        std::allocator<char>::~allocator(&local_3b1);
        testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                  (expected_expression,(char *)in_stack_fffffffffffffb60,pbVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
        iVar3 = (int)((ulong)expected_expression >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
        in_stack_fffffffffffffb57 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffb80));
          testing::AssertionResult::failure_message((AssertionResult *)0x1c622d);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffb80),type,(char *)file,
                     iVar3,(char *)in_stack_fffffffffffffb60);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffbb0),
                     in_stack_fffffffffffffba8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
          testing::Message::~Message((Message *)0x1c6288);
        }
        local_26c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c62f3);
        if (local_26c == 0) {
          local_26c = 0;
        }
      }
    }
  }
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_198);
  cppjieba::MixSegment::~MixSegment
            ((MixSegment *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  return;
}

Assistant:

TEST(MixSegmentTest, Test1) {
  MixSegment segment("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8");;
  string sentence;
  vector<string> words;
  string actual;
  string expected;

  {
    sentence = "我来自北京邮电大学。。。学号123456，用AK47";
    expected = "我/来自/北京邮电大学/。/。/。/学号/123456/，/用/AK47";
    segment.Cut(sentence, words);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }

  {
    sentence = "B超 T恤";
    expected = "B超/ /T恤";
    segment.Cut(sentence, words);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }

  {
    sentence = "他来到了网易杭研大厦";
    expected = "他/来到/了/网易/杭/研/大厦";
    segment.Cut(sentence, words, false);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }

  {
    sentence = "他来到了网易杭研大厦";
    expected = "他/来到/了/网易/杭研/大厦";
    segment.Cut(sentence, words);
    actual = Join(words.begin(), words.end(), "/");
    ASSERT_EQ(actual, expected);
  }
}